

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O0

void fio_ls_embd_push(fio_ls_embd_s *dest,fio_ls_embd_s *node)

{
  fio_ls_embd_s *node_local;
  fio_ls_embd_s *dest_local;
  
  if ((dest != (fio_ls_embd_s *)0x0) && (node != (fio_ls_embd_s *)0x0)) {
    node->prev = dest->prev;
    node->next = dest;
    dest->prev->next = node;
    dest->prev = node;
  }
  return;
}

Assistant:

FIO_FUNC inline void fio_ls_embd_push(fio_ls_embd_s *dest,
                                      fio_ls_embd_s *node) {
  if (!dest || !node)
    return;
  node->prev = dest->prev;
  node->next = dest;
  dest->prev->next = node;
  dest->prev = node;
}